

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O3

HPDF_ExtGState HPDF_CreateExtGState(HPDF_Doc pdf)

{
  HPDF_BOOL HVar1;
  HPDF_Dict p_Var2;
  HPDF_PDFVer HVar3;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 != 0) {
    HVar3 = HPDF_VER_14;
    if (HPDF_VER_14 < pdf->pdf_version) {
      HVar3 = pdf->pdf_version;
    }
    pdf->pdf_version = HVar3;
    p_Var2 = HPDF_ExtGState_New(pdf->mmgr,pdf->xref);
    if (p_Var2 != (HPDF_Dict)0x0) {
      return p_Var2;
    }
    HPDF_CheckError(&pdf->error);
  }
  return (HPDF_ExtGState)0x0;
}

Assistant:

HPDF_EXPORT(HPDF_ExtGState)
HPDF_CreateExtGState  (HPDF_Doc  pdf)
{
    HPDF_ExtGState ext_gstate;

    if (!HPDF_HasDoc (pdf))
        return NULL;

    pdf->pdf_version = (pdf->pdf_version > HPDF_VER_14 ? pdf->pdf_version : HPDF_VER_14);

    ext_gstate = HPDF_ExtGState_New (pdf->mmgr, pdf->xref);
    if (!ext_gstate)
        HPDF_CheckError (&pdf->error);

    return ext_gstate;
}